

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O1

Chuck * FindSmallestFit(Chuck *start,Size size)

{
  ulong uVar1;
  
  while( true ) {
    if (start == (Chuck *)0x0) {
      return (Chuck *)0x0;
    }
    uVar1 = (ulong)(*(uint *)&start->field_0x4 >> 1);
    if (((&start->field_0x4)[uVar1 * 8] & 1) != 0) break;
    if (size <= uVar1 << 3) {
      return start;
    }
    start = start->next;
  }
  __assert_fail("!GetUsed(current)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x71,"Chuck *FindSmallestFit(Chuck *, Size)");
}

Assistant:

static Chuck *FindSmallestFit(Chuck *start, Size size) {
    for (Chuck *current = start; current; current = current->next) {
        assert(!GetUsed(current));
        if (GetSize(current) >= size) {
            return current;
        }
    }
    return NULL;
}